

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderOperatorTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::ShaderOperatorCase::ShaderOperatorCase
          (ShaderOperatorCase *this,Context *context,char *caseName,char *description,
          bool isVertexCase,ShaderEvalFunc evalFunc,char *shaderOp,ShaderDataSpec *spec)

{
  float w_;
  float w__00;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  TestContext *testCtx;
  RenderContext *renderCtx;
  ContextInfo *ctxInfo;
  char *pcVar4;
  ostream *poVar5;
  reference this_00;
  uint uVar6;
  long lVar7;
  int precision_00;
  int precision_01;
  float y_;
  char *local_5c8;
  Precision local_558;
  ostream *local_550;
  char *local_548;
  Vector<float,_4> local_510;
  Vector<float,_4> local_500;
  Vector<float,_4> local_4f0;
  Vector<float,_4> local_4e0;
  undefined1 local_4d0 [8];
  Vec4 row;
  int rowNdx;
  Mat4 attribMatrix;
  float maxBias;
  float minBias;
  float scale;
  ShaderValue *v;
  string local_460 [4];
  int inputNdx;
  string local_440 [36];
  int local_41c;
  undefined1 local_418 [4];
  int i_4;
  string local_3f8;
  float local_3d8;
  float local_3d4;
  float resultBias;
  float resultScale;
  int outScalarSize;
  bool isResFloatVec;
  bool isBoolOut;
  char *outTypeName;
  char *swizzle;
  char *typeName;
  int local_3a8;
  bool isBool;
  DataType DStack_3a4;
  bool isInt;
  int inSize;
  DataType inType;
  int i_3;
  string prefix;
  int local_370;
  int i_2;
  int i_1;
  Precision prec;
  bool isIntVal;
  bool isBoolVal;
  int i;
  ostringstream *op;
  ostringstream frag;
  ostringstream local_1e0 [8];
  ostringstream vtx;
  char *inputPrecision [3];
  char *precision;
  ShaderEvalFunc evalFunc_local;
  bool isVertexCase_local;
  char *description_local;
  char *caseName_local;
  Context *context_local;
  ShaderOperatorCase *this_local;
  
  (this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderOperatorCase_00cabd30;
  testCtx = Context::getTestContext(context);
  renderCtx = Context::getRenderContext(context);
  ctxInfo = Context::getContextInfo(context);
  deqp::gls::ShaderRenderCase::ShaderRenderCase
            (&this->super_ShaderRenderCase,testCtx,renderCtx,ctxInfo,caseName,description,
             isVertexCase,&(this->m_evaluator).super_ShaderEvaluator);
  (this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderOperatorCase_00cabd30;
  OperatorShaderEvaluator::OperatorShaderEvaluator
            (&this->m_evaluator,evalFunc,spec->resultScale,spec->resultBias);
  if (spec->precision == PRECISION_LAST) {
    local_548 = (char *)0x0;
  }
  else {
    local_548 = glu::getPrecisionName(spec->precision);
  }
  inputPrecision[2] = local_548;
  std::__cxx11::ostringstream::ostringstream(local_1e0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&op);
  if (isVertexCase) {
    local_550 = (ostream *)local_1e0;
  }
  else {
    local_550 = (ostream *)&op;
  }
  for (prec = PRECISION_LOWP; (int)prec < spec->numInputs; prec = prec + PRECISION_MEDIUMP) {
    bVar1 = de::inRange<int>(spec->inputs[(int)prec].type,0x23,0x26);
    bVar2 = de::inRange<int>(spec->inputs[(int)prec].type,0x1b,0x1e);
    if ((bVar1) || ((bVar2 && (spec->precision == PRECISION_LOWP)))) {
      local_558 = PRECISION_MEDIUMP;
    }
    else {
      local_558 = spec->precision;
    }
    pcVar4 = glu::getPrecisionName(local_558);
    inputPrecision[(long)(int)prec + -1] = pcVar4;
  }
  std::operator<<((ostream *)local_1e0,"attribute highp vec4 a_position;\n");
  for (local_370 = 0; local_370 < spec->numInputs; local_370 = local_370 + 1) {
    poVar5 = std::operator<<((ostream *)local_1e0,"attribute ");
    poVar5 = std::operator<<(poVar5,inputPrecision[(long)local_370 + -1]);
    poVar5 = std::operator<<(poVar5," vec4 a_in");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_370);
    std::operator<<(poVar5,";\n");
  }
  if (isVertexCase) {
    std::operator<<((ostream *)local_1e0,"varying mediump vec4 v_color;\n");
    std::operator<<((ostream *)&op,"varying mediump vec4 v_color;\n");
  }
  else {
    for (prefix.field_2._12_4_ = 0; (int)prefix.field_2._12_4_ < spec->numInputs;
        prefix.field_2._12_4_ = prefix.field_2._12_4_ + 1) {
      poVar5 = std::operator<<((ostream *)local_1e0,"varying ");
      poVar5 = std::operator<<(poVar5,inputPrecision[(long)(int)prefix.field_2._12_4_ + -1]);
      poVar5 = std::operator<<(poVar5," vec4 v_in");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,prefix.field_2._12_4_);
      std::operator<<(poVar5,";\n");
      poVar5 = std::operator<<((ostream *)&op,"varying ");
      poVar5 = std::operator<<(poVar5,inputPrecision[(long)(int)prefix.field_2._12_4_ + -1]);
      poVar5 = std::operator<<(poVar5," vec4 v_in");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,prefix.field_2._12_4_);
      std::operator<<(poVar5,";\n");
    }
  }
  std::operator<<((ostream *)local_1e0,"\n");
  std::operator<<((ostream *)local_1e0,"void main()\n");
  std::operator<<((ostream *)local_1e0,"{\n");
  std::operator<<((ostream *)local_1e0,"\tgl_Position = a_position;\n");
  std::operator<<((ostream *)&op,"\n");
  std::operator<<((ostream *)&op,"void main()\n");
  std::operator<<((ostream *)&op,"{\n");
  if (isVertexCase) {
    local_5c8 = "a_";
  }
  else {
    local_5c8 = "v_";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&i_3,local_5c8,(allocator<char> *)((long)&inType + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&inType + 3));
  for (inSize = 0; inSize < spec->numInputs; inSize = inSize + 1) {
    DStack_3a4 = spec->inputs[inSize].type;
    local_3a8 = glu::getDataTypeScalarSize(DStack_3a4);
    typeName._7_1_ = de::inRange<int>(DStack_3a4,0x1b,0x1e);
    typeName._6_1_ = de::inRange<int>(DStack_3a4,0x23,0x26);
    swizzle = glu::getDataTypeName(DStack_3a4);
    outTypeName = *(char **)(s_inSwizzles + (long)(local_3a8 + -1) * 8 + (long)inSize * 0x20);
    std::operator<<(local_550,"\t");
    if ((inputPrecision[2] != (char *)0x0) && ((typeName._6_1_ & 1) == 0)) {
      poVar5 = std::operator<<(local_550,inputPrecision[2]);
      std::operator<<(poVar5," ");
    }
    poVar5 = std::operator<<(local_550,swizzle);
    poVar5 = std::operator<<(poVar5," in");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,inSize);
    std::operator<<(poVar5," = ");
    if ((typeName._6_1_ & 1) == 0) {
      if ((typeName._7_1_ & 1) != 0) {
        poVar5 = std::operator<<(local_550,swizzle);
        std::operator<<(poVar5,"(");
      }
    }
    else if (local_3a8 == 1) {
      std::operator<<(local_550,"(");
    }
    else {
      std::operator<<(local_550,"greaterThan(");
    }
    poVar5 = std::operator<<(local_550,(string *)&i_3);
    poVar5 = std::operator<<(poVar5,"in");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,inSize);
    poVar5 = std::operator<<(poVar5,".");
    std::operator<<(poVar5,outTypeName);
    if ((typeName._6_1_ & 1) == 0) {
      if ((typeName._7_1_ & 1) != 0) {
        std::operator<<(local_550,")");
      }
    }
    else if (local_3a8 == 1) {
      std::operator<<(local_550," > 0.0)");
    }
    else {
      poVar5 = std::operator<<(local_550,", vec");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_3a8);
      std::operator<<(poVar5,"(0.0))");
    }
    std::operator<<(local_550,";\n");
  }
  _outScalarSize = glu::getDataTypeName(spec->output);
  resultScale._3_1_ = de::inRange<int>(spec->output,0x23,0x26);
  std::operator<<(local_550,"\t");
  if ((inputPrecision[2] != (char *)0x0) && ((resultScale._3_1_ & 1) == 0)) {
    poVar5 = std::operator<<(local_550,inputPrecision[2]);
    std::operator<<(poVar5," ");
  }
  poVar5 = std::operator<<(local_550,_outScalarSize);
  poVar5 = std::operator<<(poVar5," res = ");
  poVar5 = std::operator<<(poVar5,_outScalarSize);
  std::operator<<(poVar5,"(0.0);\n\n");
  poVar5 = std::operator<<(local_550,"\t");
  poVar5 = std::operator<<(poVar5,shaderOp);
  std::operator<<(poVar5,"\n\n");
  resultScale._2_1_ = de::inRange<int>(spec->output,1,4);
  resultBias = (float)glu::getDataTypeScalarSize(spec->output);
  std::operator<<(local_550,"\tmediump vec4 color = vec4(0.0, 0.0, 0.0, 1.0);\n");
  poVar5 = std::operator<<(local_550,"\tcolor.");
  poVar5 = std::operator<<(poVar5,*(char **)(s_outSwizzles + (long)((int)resultBias + -1) * 8));
  std::operator<<(poVar5," = ");
  if (((resultScale._2_1_ & 1) == 0) && (resultBias == 1.4013e-45)) {
    std::operator<<(local_550,"float(res)");
  }
  else if ((resultScale._2_1_ & 1) == 0) {
    poVar5 = std::operator<<(local_550,"vec");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)resultBias);
    std::operator<<(poVar5,"(res)");
  }
  else {
    std::operator<<(local_550,"res");
  }
  std::operator<<(local_550,";\n");
  local_3d4 = spec->resultScale;
  local_3d8 = spec->resultBias;
  if ((((local_3d4 != 1.0) || (NAN(local_3d4))) || (local_3d8 != 0.0)) || (NAN(local_3d8))) {
    std::operator<<(local_550,"\tcolor = color");
    if ((local_3d4 != 1.0) || (NAN(local_3d4))) {
      poVar5 = std::operator<<(local_550," * ");
      de::floatToString_abi_cxx11_(&local_3f8,(de *)0x2,local_3d4,precision_00);
      std::operator<<(poVar5,(string *)&local_3f8);
      std::__cxx11::string::~string((string *)&local_3f8);
    }
    if ((local_3d8 != 0.0) || (NAN(local_3d8))) {
      poVar5 = std::operator<<(local_550," + ");
      de::floatToString_abi_cxx11_((string *)local_418,(de *)0x2,local_3d8,precision_01);
      std::operator<<(poVar5,(string *)local_418);
      std::__cxx11::string::~string((string *)local_418);
    }
    std::operator<<(local_550,";\n");
  }
  if (isVertexCase) {
    std::operator<<((ostream *)local_1e0,"\tv_color = color;\n");
    std::operator<<((ostream *)&op,"\tgl_FragColor = v_color;\n");
  }
  else {
    for (local_41c = 0; local_41c < spec->numInputs; local_41c = local_41c + 1) {
      poVar5 = std::operator<<((ostream *)local_1e0,"\tv_in");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_41c);
      poVar5 = std::operator<<(poVar5," = a_in");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_41c);
      std::operator<<(poVar5,";\n");
    }
    std::operator<<((ostream *)&op,"\tgl_FragColor = color;\n");
  }
  std::operator<<((ostream *)local_1e0,"}\n");
  std::operator<<((ostream *)&op,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_vertShaderSource,local_440);
  std::__cxx11::string::~string(local_440);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_fragShaderSource,local_460);
  std::__cxx11::string::~string(local_460);
  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::resize
            (&(this->super_ShaderRenderCase).m_userAttribTransforms,(long)spec->numInputs);
  for (v._4_4_ = 0; v._4_4_ < spec->numInputs; v._4_4_ = v._4_4_ + 1) {
    lVar7 = (long)v._4_4_;
    y_ = spec->inputs[lVar7].rangeMax - spec->inputs[lVar7].rangeMin;
    w_ = spec->inputs[lVar7].rangeMin;
    w__00 = spec->inputs[lVar7].rangeMax;
    tcu::Matrix<float,_4,_4>::Matrix((Matrix<float,_4,_4> *)(row.m_data + 3));
    for (row.m_data[2] = 0.0; (int)row.m_data[2] < 4;
        row.m_data[2] = (float)((int)row.m_data[2] + 1)) {
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_4d0);
      uVar3 = (int)row.m_data[2] + v._4_4_;
      uVar6 = uVar3;
      if ((int)uVar3 < 0) {
        uVar6 = (int)row.m_data[2] + 3 + v._4_4_;
      }
      switch(uVar3 - (uVar6 & 0xfffffffc)) {
      case 0:
        tcu::Vector<float,_4>::Vector(&local_4e0,y_,0.0,0.0,w_);
        local_4d0._0_4_ = local_4e0.m_data[0];
        local_4d0._4_4_ = local_4e0.m_data[1];
        row.m_data[0] = local_4e0.m_data[2];
        row.m_data[1] = local_4e0.m_data[3];
        break;
      case 1:
        tcu::Vector<float,_4>::Vector(&local_4f0,0.0,y_,0.0,w_);
        local_4d0._0_4_ = local_4f0.m_data[0];
        local_4d0._4_4_ = local_4f0.m_data[1];
        row.m_data[0] = local_4f0.m_data[2];
        row.m_data[1] = local_4f0.m_data[3];
        break;
      case 2:
        tcu::Vector<float,_4>::Vector(&local_500,-y_,0.0,0.0,w__00);
        local_4d0._0_4_ = local_500.m_data[0];
        local_4d0._4_4_ = local_500.m_data[1];
        row.m_data[0] = local_500.m_data[2];
        row.m_data[1] = local_500.m_data[3];
        break;
      case 3:
        tcu::Vector<float,_4>::Vector(&local_510,0.0,-y_,0.0,w__00);
        local_4d0._0_4_ = local_510.m_data[0];
        local_4d0._4_4_ = local_510.m_data[1];
        row.m_data[0] = local_510.m_data[2];
        row.m_data[1] = local_510.m_data[3];
      }
      tcu::Matrix<float,_4,_4>::setRow
                ((Matrix<float,_4,_4> *)(row.m_data + 3),(int)row.m_data[2],
                 (Vector<float,_4> *)local_4d0);
    }
    this_00 = std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::
              operator[](&(this->super_ShaderRenderCase).m_userAttribTransforms,(long)v._4_4_);
    tcu::Matrix<float,_4,_4>::operator=(this_00,(Matrix<float,_4,_4> *)(row.m_data + 3));
    tcu::Matrix<float,_4,_4>::~Matrix((Matrix<float,_4,_4> *)(row.m_data + 3));
  }
  std::__cxx11::string::~string((string *)&i_3);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&op);
  std::__cxx11::ostringstream::~ostringstream(local_1e0);
  return;
}

Assistant:

ShaderOperatorCase::ShaderOperatorCase (Context& context, const char* caseName, const char* description, bool isVertexCase, ShaderEvalFunc evalFunc, const char* shaderOp, const ShaderDataSpec& spec)
	: ShaderRenderCase(context.getTestContext(), context.getRenderContext(), context.getContextInfo(), caseName, description, isVertexCase, m_evaluator)
	, m_evaluator(evalFunc, spec.resultScale, spec.resultBias)
{
	const char*		precision	= spec.precision != PRECISION_LAST ? getPrecisionName(spec.precision) : DE_NULL;
	const char*		inputPrecision[MAX_INPUTS];

	ostringstream	vtx;
	ostringstream	frag;
	ostringstream&	op			= isVertexCase ? vtx : frag;

	// Compute precision for inputs.
	for (int i = 0; i < spec.numInputs; i++)
	{
		bool		isBoolVal	= de::inRange<int>(spec.inputs[i].type, TYPE_BOOL, TYPE_BOOL_VEC4);
		bool		isIntVal	= de::inRange<int>(spec.inputs[i].type, TYPE_INT, TYPE_INT_VEC4);
		// \note Mediump interpolators are used for booleans and lowp ints.
		Precision	prec		= isBoolVal || (isIntVal && spec.precision == PRECISION_LOWP) ? PRECISION_MEDIUMP : spec.precision;
		inputPrecision[i] = getPrecisionName(prec);
	}

	// Attributes.
	vtx << "attribute highp vec4 a_position;\n";
	for (int i = 0; i < spec.numInputs; i++)
		vtx << "attribute " << inputPrecision[i] << " vec4 a_in" << i << ";\n";

	if (isVertexCase)
	{
		vtx << "varying mediump vec4 v_color;\n";
		frag << "varying mediump vec4 v_color;\n";
	}
	else
	{
		for (int i = 0; i < spec.numInputs; i++)
		{
			vtx << "varying " << inputPrecision[i] << " vec4 v_in" << i << ";\n";
			frag << "varying " << inputPrecision[i] << " vec4 v_in" << i << ";\n";
		}
	}

	vtx << "\n";
	vtx << "void main()\n";
	vtx << "{\n";
	vtx << "	gl_Position = a_position;\n";

	frag << "\n";
	frag << "void main()\n";
	frag << "{\n";

	// Expression inputs.
	string prefix = isVertexCase ? "a_" : "v_";
	for (int i = 0; i < spec.numInputs; i++)
	{
		DataType		inType		= spec.inputs[i].type;
		int				inSize		= getDataTypeScalarSize(inType);
		bool			isInt		= de::inRange<int>(inType, TYPE_INT, TYPE_INT_VEC4);
		bool			isBool		= de::inRange<int>(inType, TYPE_BOOL, TYPE_BOOL_VEC4);
		const char*		typeName	= getDataTypeName(inType);
		const char*		swizzle		= s_inSwizzles[i][inSize-1];

		op << "\t";
		if (precision && !isBool) op << precision << " ";

		op << typeName << " in" << i << " = ";

		if (isBool)
		{
			if (inSize == 1)	op << "(";
			else				op << "greaterThan(";
		}
		else if (isInt)
			op << typeName << "(";

		op << prefix << "in" << i << "." << swizzle;

		if (isBool)
		{
			if (inSize == 1)	op << " > 0.0)";
			else				op << ", vec" << inSize << "(0.0))";
		}
		else if (isInt)
			op << ")";

		op << ";\n";
	}

	// Result variable.
	{
		const char* outTypeName = getDataTypeName(spec.output);
		bool		isBoolOut	= de::inRange<int>(spec.output, TYPE_BOOL, TYPE_BOOL_VEC4);

		op << "\t";
		if (precision && !isBoolOut) op << precision << " ";
		op << outTypeName << " res = " << outTypeName << "(0.0);\n\n";
	}

	// Expression.
	op << "\t" << shaderOp << "\n\n";

	// Convert to color.
	bool	isResFloatVec	= de::inRange<int>(spec.output, TYPE_FLOAT, TYPE_FLOAT_VEC4);
	int		outScalarSize	= getDataTypeScalarSize(spec.output);

	op << "\tmediump vec4 color = vec4(0.0, 0.0, 0.0, 1.0);\n";
	op << "\tcolor." << s_outSwizzles[outScalarSize-1] << " = ";

	if (!isResFloatVec && outScalarSize == 1)
		op << "float(res)";
	else if (!isResFloatVec)
		op << "vec" << outScalarSize << "(res)";
	else
		op << "res";

	op << ";\n";

	// Scale & bias.
	float	resultScale		= spec.resultScale;
	float	resultBias		= spec.resultBias;
	if ((resultScale != 1.0f) || (resultBias != 0.0f))
	{
		op << "\tcolor = color";
		if (resultScale != 1.0f) op << " * " << de::floatToString(resultScale, 2);
		if (resultBias != 0.0f)  op << " + " << de::floatToString(resultBias, 2);
		op << ";\n";
	}

	// ..
	if (isVertexCase)
	{
		vtx << "	v_color = color;\n";
		frag << "	gl_FragColor = v_color;\n";
	}
	else
	{
		for (int i = 0; i < spec.numInputs; i++)
		vtx << "	v_in" << i << " = a_in" << i << ";\n";
		frag << "	gl_FragColor = color;\n";
	}

	vtx << "}\n";
	frag << "}\n";

	m_vertShaderSource = vtx.str();
	m_fragShaderSource = frag.str();

	// Setup the user attributes.
	m_userAttribTransforms.resize(spec.numInputs);
	for (int inputNdx = 0; inputNdx < spec.numInputs; inputNdx++)
	{
		const ShaderValue& v = spec.inputs[inputNdx];
		DE_ASSERT(v.type != TYPE_LAST);

		float scale		= (v.rangeMax - v.rangeMin);
		float minBias	= v.rangeMin;
		float maxBias	= v.rangeMax;
		Mat4  attribMatrix;

		for (int rowNdx = 0; rowNdx < 4; rowNdx++)
		{
			Vec4 row;

			switch ((rowNdx + inputNdx) % 4)
			{
				case 0:	row = Vec4(scale, 0.0f, 0.0f, minBias);		break;
				case 1:	row = Vec4(0.0f, scale, 0.0f, minBias);		break;
				case 2:	row = Vec4(-scale, 0.0f, 0.0f, maxBias);	break;
				case 3:	row = Vec4(0.0f, -scale, 0.0f, maxBias);	break;
				default: DE_ASSERT(false);
			}

			attribMatrix.setRow(rowNdx, row);
		}

		m_userAttribTransforms[inputNdx] = attribMatrix;
	}
}